

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

void __thiscall
absl::inlined_vector_internal::
IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
::AssignNext(IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
             *this,Pointer<std::allocator<absl::status_internal::Payload>_> assign_at)

{
  Payload *pPVar1;
  CordRep *pCVar2;
  
  pPVar1 = (this->it_)._M_current;
  std::__cxx11::string::operator=((string *)assign_at,(string *)pPVar1);
  if (((assign_at->payload).contents_.data_.rep_.field_0.data[0] & 1U) != 0) {
    Cord::InlineRep::UnrefTree(&(assign_at->payload).contents_);
  }
  pCVar2 = (pPVar1->payload).contents_.data_.rep_.field_0.as_tree.rep;
  (assign_at->payload).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (pPVar1->payload).contents_.data_.rep_.field_0.as_tree.cordz_info;
  (assign_at->payload).contents_.data_.rep_.field_0.as_tree.rep = pCVar2;
  (pPVar1->payload).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (pPVar1->payload).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  (this->it_)._M_current = (this->it_)._M_current + 1;
  return;
}

Assistant:

void AssignNext(Pointer<A> assign_at) {
    *assign_at = *it_;
    ++it_;
  }